

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_erase_result_t art_erase_at(art_node_t *node,art_key_chunk_t *key,uint8_t depth)

{
  art_node_t aVar1;
  art_key_chunk_t key_chunk;
  uint8_t offset;
  long lVar2;
  art_node_t *node_00;
  art_node_t *new_child;
  art_node_t aVar3;
  ulong uVar4;
  art_val_t *paVar5;
  art_erase_result_t aVar6;
  
  if (((ulong)node & 1) == 0) {
    aVar1 = node[1];
    aVar3 = aVar1;
    if ((byte)(6 - depth) < (byte)aVar1) {
      aVar3 = (art_node_t)(6 - depth);
    }
    if (aVar3 == (art_node_t)0x0) {
      aVar3 = (art_node_t)0x0;
    }
    else {
      uVar4 = 0;
      do {
        if (node[uVar4 + 2] != *(art_node_t *)(key + ((uint)depth + (int)uVar4))) {
          aVar3 = SUB81(uVar4,0);
          break;
        }
        uVar4 = uVar4 + 1;
      } while ((byte)aVar3 != uVar4);
    }
    if (aVar3 == aVar1) {
      key_chunk = key[(ulong)depth + (ulong)(byte)aVar3];
      node_00 = art_find_child((art_inner_node_t *)node,key_chunk);
      if (node_00 != (art_node_t *)0x0) {
        aVar6 = art_erase_at(node_00,key,(char)((ulong)depth + (ulong)(byte)aVar3) + '\x01');
        paVar5 = aVar6.value_erased;
        new_child = aVar6.rootmost_node;
        if (paVar5 != (art_val_t *)0x0) {
          if (new_child == (art_node_t *)0x0) {
            node = art_node_erase((art_inner_node_t *)node,key_chunk);
          }
          else if (new_child != node_00) {
            art_replace((art_inner_node_t *)node,key_chunk,new_child);
          }
          goto LAB_0010dc4a;
        }
      }
    }
    node = (art_node_t *)0x0;
    paVar5 = (art_val_t *)0x0;
  }
  else {
    lVar2 = 0;
    do {
      if (((art_val_t *)((ulong)node & 0xfffffffffffffffe))->key[lVar2] != key[lVar2])
      goto LAB_0010dbd9;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    lVar2 = 6;
LAB_0010dbd9:
    paVar5 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
    if ((char)lVar2 != '\x06') {
      paVar5 = (art_val_t *)0x0;
    }
    node = (art_node_t *)0x0;
  }
LAB_0010dc4a:
  aVar6.value_erased = paVar5;
  aVar6.rootmost_node = node;
  return aVar6;
}

Assistant:

static art_erase_result_t art_erase_at(art_node_t *node,
                                       const art_key_chunk_t *key,
                                       uint8_t depth) {
    art_erase_result_t result;
    result.rootmost_node = NULL;
    result.value_erased = NULL;

    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        uint8_t common_prefix = art_common_prefix(leaf->key, 0, ART_KEY_BYTES,
                                                  key, 0, ART_KEY_BYTES);
        if (common_prefix != ART_KEY_BYTES) {
            // Leaf key mismatch.
            return result;
        }
        result.value_erased = (art_val_t *)leaf;
        return result;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)node;
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Prefix mismatch.
        return result;
    }
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_node_t *child = art_find_child(inner_node, key_chunk);
    if (child == NULL) {
        // No child with key chunk.
        return result;
    }
    // Try to erase the key further down. Skip the key chunk associated with the
    // child in the node.
    art_erase_result_t child_result =
        art_erase_at(child, key, depth + common_prefix + 1);
    if (child_result.value_erased == NULL) {
        return result;
    }
    result.value_erased = child_result.value_erased;
    result.rootmost_node = node;
    if (child_result.rootmost_node == NULL) {
        // Child node was fully erased, erase it from this node's children.
        result.rootmost_node = art_node_erase(inner_node, key_chunk);
    } else if (child_result.rootmost_node != child) {
        // Child node was not fully erased, update the pointer to it in this
        // node.
        art_replace(inner_node, key_chunk, child_result.rootmost_node);
    }
    return result;
}